

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O2

int Dch_NodeIsConst(void *p,Aig_Obj_t *pObj)

{
  uint *puVar1;
  void *pvVar2;
  void *pvVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
  uVar6 = 0;
  pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
  uVar5 = (ulong)((long)pvVar2 - (long)pvVar3) >> 2;
  puVar4 = Dch_ObjSim((Vec_Ptr_t *)p,pObj);
  if (0 < (int)uVar5) {
    uVar6 = uVar5 & 0xffffffff;
  }
  if ((pObj->field_0x18 & 8) == 0) {
    uVar5 = 0;
    do {
      if (uVar6 == uVar5) {
        return 1;
      }
      puVar1 = puVar4 + uVar5;
      uVar5 = uVar5 + 1;
    } while (*puVar1 == 0);
  }
  else {
    uVar5 = 0;
    do {
      if (uVar6 == uVar5) {
        return 1;
      }
      puVar1 = puVar4 + uVar5;
      uVar5 = uVar5 + 1;
    } while (*puVar1 == 0xffffffff);
  }
  return 0;
}

Assistant:

int Dch_NodeIsConst( void * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim  = Dch_ObjSim( vSims, pObj );
    if ( pObj->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( ~pSim[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim[k] )
                return 0;
    }
    return 1;
}